

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O2

void transpose_16x8(uchar *in0,uchar *in1,int in_p,uchar *out,int out_p)

{
  uchar *puVar1;
  ulong uVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [12];
  unkbyte10 Var10;
  undefined1 auVar11 [14];
  undefined1 auVar12 [12];
  unkbyte10 Var13;
  undefined1 auVar14 [14];
  undefined1 auVar15 [12];
  unkbyte10 Var16;
  undefined1 auVar17 [14];
  undefined1 auVar18 [12];
  unkbyte10 Var19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [14];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [14];
  undefined1 auVar25 [12];
  undefined1 auVar26 [14];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [14];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  long lVar32;
  undefined4 uVar33;
  undefined1 auVar35 [16];
  undefined4 uVar44;
  undefined1 auVar46 [16];
  undefined4 uVar55;
  undefined1 auVar57 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined4 uVar82;
  undefined1 auVar84 [16];
  undefined1 auVar93 [16];
  undefined1 auVar97 [16];
  undefined1 auVar104 [16];
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar119 [16];
  undefined1 auVar122 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar34 [12];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar45 [12];
  undefined1 auVar54 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar56 [12];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar83 [12];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  
  uVar2 = *(ulong *)in0;
  lVar32 = (long)in_p;
  uVar3 = *(undefined8 *)(in0 + lVar32);
  auVar42._8_6_ = 0;
  auVar42._0_8_ = uVar2;
  auVar42[0xe] = (char)(uVar2 >> 0x38);
  auVar42[0xf] = (char)((ulong)uVar3 >> 0x38);
  auVar41._14_2_ = auVar42._14_2_;
  auVar41._8_5_ = 0;
  auVar41._0_8_ = uVar2;
  auVar41[0xd] = (char)((ulong)uVar3 >> 0x30);
  auVar40._13_3_ = auVar41._13_3_;
  auVar40._8_4_ = 0;
  auVar40._0_8_ = uVar2;
  auVar40[0xc] = (char)(uVar2 >> 0x30);
  auVar39._12_4_ = auVar40._12_4_;
  auVar39._8_3_ = 0;
  auVar39._0_8_ = uVar2;
  auVar39[0xb] = (char)((ulong)uVar3 >> 0x28);
  auVar38._11_5_ = auVar39._11_5_;
  auVar38._8_2_ = 0;
  auVar38._0_8_ = uVar2;
  auVar38[10] = (char)(uVar2 >> 0x28);
  auVar37._10_6_ = auVar38._10_6_;
  auVar37[8] = 0;
  auVar37._0_8_ = uVar2;
  auVar37[9] = (char)((ulong)uVar3 >> 0x20);
  auVar36._9_7_ = auVar37._9_7_;
  auVar36[8] = (char)(uVar2 >> 0x20);
  auVar36._0_8_ = uVar2;
  Var10 = CONCAT91(CONCAT81(auVar36._8_8_,(char)((ulong)uVar3 >> 0x18)),(char)(uVar2 >> 0x18));
  auVar9._2_10_ = Var10;
  auVar9[1] = (char)((ulong)uVar3 >> 0x10);
  auVar9[0] = (char)(uVar2 >> 0x10);
  auVar8._2_12_ = auVar9;
  auVar8[1] = (char)((ulong)uVar3 >> 8);
  auVar8[0] = (char)(uVar2 >> 8);
  auVar35._0_2_ = CONCAT11((char)uVar3,(char)uVar2);
  auVar35._2_14_ = auVar8;
  uVar2 = *(ulong *)(in0 + lVar32 * 2);
  uVar3 = *(undefined8 *)(in0 + lVar32 * 3);
  auVar73._8_6_ = 0;
  auVar73._0_8_ = uVar2;
  auVar73[0xe] = (char)(uVar2 >> 0x38);
  auVar73[0xf] = (char)((ulong)uVar3 >> 0x38);
  auVar72._14_2_ = auVar73._14_2_;
  auVar72._8_5_ = 0;
  auVar72._0_8_ = uVar2;
  auVar72[0xd] = (char)((ulong)uVar3 >> 0x30);
  auVar71._13_3_ = auVar72._13_3_;
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar2;
  auVar71[0xc] = (char)(uVar2 >> 0x30);
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._8_3_ = 0;
  auVar70._0_8_ = uVar2;
  auVar70[0xb] = (char)((ulong)uVar3 >> 0x28);
  auVar69._11_5_ = auVar70._11_5_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar2;
  auVar69[10] = (char)(uVar2 >> 0x28);
  auVar68._10_6_ = auVar69._10_6_;
  auVar68[8] = 0;
  auVar68._0_8_ = uVar2;
  auVar68[9] = (char)((ulong)uVar3 >> 0x20);
  auVar67._9_7_ = auVar68._9_7_;
  auVar67[8] = (char)(uVar2 >> 0x20);
  auVar67._0_8_ = uVar2;
  Var13 = CONCAT91(CONCAT81(auVar67._8_8_,(char)((ulong)uVar3 >> 0x18)),(char)(uVar2 >> 0x18));
  auVar12._2_10_ = Var13;
  auVar12[1] = (char)((ulong)uVar3 >> 0x10);
  auVar12[0] = (char)(uVar2 >> 0x10);
  auVar11._2_12_ = auVar12;
  auVar11[1] = (char)((ulong)uVar3 >> 8);
  auVar11[0] = (char)(uVar2 >> 8);
  uVar4 = *(ulong *)(in0 + lVar32 * 4);
  uVar5 = *(undefined8 *)(in0 + lVar32 * 5);
  auVar64._8_6_ = 0;
  auVar64._0_8_ = uVar4;
  auVar64[0xe] = (char)(uVar4 >> 0x38);
  auVar64[0xf] = (char)((ulong)uVar5 >> 0x38);
  auVar63._14_2_ = auVar64._14_2_;
  auVar63._8_5_ = 0;
  auVar63._0_8_ = uVar4;
  auVar63[0xd] = (char)((ulong)uVar5 >> 0x30);
  auVar62._13_3_ = auVar63._13_3_;
  auVar62._8_4_ = 0;
  auVar62._0_8_ = uVar4;
  auVar62[0xc] = (char)(uVar4 >> 0x30);
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._8_3_ = 0;
  auVar61._0_8_ = uVar4;
  auVar61[0xb] = (char)((ulong)uVar5 >> 0x28);
  auVar60._11_5_ = auVar61._11_5_;
  auVar60._8_2_ = 0;
  auVar60._0_8_ = uVar4;
  auVar60[10] = (char)(uVar4 >> 0x28);
  auVar59._10_6_ = auVar60._10_6_;
  auVar59[8] = 0;
  auVar59._0_8_ = uVar4;
  auVar59[9] = (char)((ulong)uVar5 >> 0x20);
  auVar58._9_7_ = auVar59._9_7_;
  auVar58[8] = (char)(uVar4 >> 0x20);
  auVar58._0_8_ = uVar4;
  Var16 = CONCAT91(CONCAT81(auVar58._8_8_,(char)((ulong)uVar5 >> 0x18)),(char)(uVar4 >> 0x18));
  auVar15._2_10_ = Var16;
  auVar15[1] = (char)((ulong)uVar5 >> 0x10);
  auVar15[0] = (char)(uVar4 >> 0x10);
  auVar14._2_12_ = auVar15;
  auVar14[1] = (char)((ulong)uVar5 >> 8);
  auVar14[0] = (char)(uVar4 >> 8);
  auVar57._0_2_ = CONCAT11((char)uVar5,(char)uVar4);
  auVar57._2_14_ = auVar14;
  uVar4 = *(ulong *)(in0 + lVar32 * 6);
  uVar5 = *(undefined8 *)(in0 + lVar32 * 7);
  auVar81._8_6_ = 0;
  auVar81._0_8_ = uVar4;
  auVar81[0xe] = (char)(uVar4 >> 0x38);
  auVar81[0xf] = (char)((ulong)uVar5 >> 0x38);
  auVar80._14_2_ = auVar81._14_2_;
  auVar80._8_5_ = 0;
  auVar80._0_8_ = uVar4;
  auVar80[0xd] = (char)((ulong)uVar5 >> 0x30);
  auVar79._13_3_ = auVar80._13_3_;
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar4;
  auVar79[0xc] = (char)(uVar4 >> 0x30);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_3_ = 0;
  auVar78._0_8_ = uVar4;
  auVar78[0xb] = (char)((ulong)uVar5 >> 0x28);
  auVar77._11_5_ = auVar78._11_5_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar4;
  auVar77[10] = (char)(uVar4 >> 0x28);
  auVar76._10_6_ = auVar77._10_6_;
  auVar76[8] = 0;
  auVar76._0_8_ = uVar4;
  auVar76[9] = (char)((ulong)uVar5 >> 0x20);
  auVar75._9_7_ = auVar76._9_7_;
  auVar75[8] = (char)(uVar4 >> 0x20);
  auVar75._0_8_ = uVar4;
  Var19 = CONCAT91(CONCAT81(auVar75._8_8_,(char)((ulong)uVar5 >> 0x18)),(char)(uVar4 >> 0x18));
  auVar18._2_10_ = Var19;
  auVar18[1] = (char)((ulong)uVar5 >> 0x10);
  auVar18[0] = (char)(uVar4 >> 0x10);
  auVar17._2_12_ = auVar18;
  auVar17[1] = (char)((ulong)uVar5 >> 8);
  auVar17[0] = (char)(uVar4 >> 8);
  auVar96._0_12_ = auVar35._0_12_;
  auVar96._12_2_ = (short)Var10;
  auVar96._14_2_ = (short)Var13;
  auVar95._12_4_ = auVar96._12_4_;
  auVar95._0_10_ = auVar35._0_10_;
  auVar95._10_2_ = auVar12._0_2_;
  auVar94._10_6_ = auVar95._10_6_;
  auVar94._0_8_ = auVar35._0_8_;
  auVar94._8_2_ = auVar9._0_2_;
  auVar20._4_8_ = auVar94._8_8_;
  auVar20._2_2_ = auVar11._0_2_;
  auVar20._0_2_ = auVar8._0_2_;
  auVar93._0_4_ = CONCAT22(CONCAT11((char)uVar3,(char)uVar2),auVar35._0_2_);
  auVar93._4_12_ = auVar20;
  uVar2 = *(ulong *)in1;
  uVar3 = *(undefined8 *)(in1 + lVar32);
  auVar53._8_6_ = 0;
  auVar53._0_8_ = uVar2;
  auVar53[0xe] = (char)(uVar2 >> 0x38);
  auVar53[0xf] = (char)((ulong)uVar3 >> 0x38);
  auVar52._14_2_ = auVar53._14_2_;
  auVar52._8_5_ = 0;
  auVar52._0_8_ = uVar2;
  auVar52[0xd] = (char)((ulong)uVar3 >> 0x30);
  auVar51._13_3_ = auVar52._13_3_;
  auVar51._8_4_ = 0;
  auVar51._0_8_ = uVar2;
  auVar51[0xc] = (char)(uVar2 >> 0x30);
  auVar50._12_4_ = auVar51._12_4_;
  auVar50._8_3_ = 0;
  auVar50._0_8_ = uVar2;
  auVar50[0xb] = (char)((ulong)uVar3 >> 0x28);
  auVar49._11_5_ = auVar50._11_5_;
  auVar49._8_2_ = 0;
  auVar49._0_8_ = uVar2;
  auVar49[10] = (char)(uVar2 >> 0x28);
  auVar48._10_6_ = auVar49._10_6_;
  auVar48[8] = 0;
  auVar48._0_8_ = uVar2;
  auVar48[9] = (char)((ulong)uVar3 >> 0x20);
  auVar47._9_7_ = auVar48._9_7_;
  auVar47[8] = (char)(uVar2 >> 0x20);
  auVar47._0_8_ = uVar2;
  Var10 = CONCAT91(CONCAT81(auVar47._8_8_,(char)((ulong)uVar3 >> 0x18)),(char)(uVar2 >> 0x18));
  auVar22._2_10_ = Var10;
  auVar22[1] = (char)((ulong)uVar3 >> 0x10);
  auVar22[0] = (char)(uVar2 >> 0x10);
  auVar21._2_12_ = auVar22;
  auVar21[1] = (char)((ulong)uVar3 >> 8);
  auVar21[0] = (char)(uVar2 >> 8);
  auVar46._0_2_ = CONCAT11((char)uVar3,(char)uVar2);
  auVar46._2_14_ = auVar21;
  auVar113._0_12_ = auVar57._0_12_;
  auVar113._12_2_ = (short)Var16;
  auVar113._14_2_ = (short)Var19;
  auVar112._12_4_ = auVar113._12_4_;
  auVar112._0_10_ = auVar57._0_10_;
  auVar112._10_2_ = auVar18._0_2_;
  auVar111._10_6_ = auVar112._10_6_;
  auVar111._0_8_ = auVar57._0_8_;
  auVar111._8_2_ = auVar15._0_2_;
  auVar23._4_8_ = auVar111._8_8_;
  auVar23._2_2_ = auVar17._0_2_;
  auVar23._0_2_ = auVar14._0_2_;
  uVar2 = *(ulong *)(in1 + lVar32 * 2);
  uVar3 = *(undefined8 *)(in1 + lVar32 * 3);
  auVar103._8_6_ = 0;
  auVar103._0_8_ = uVar2;
  auVar103[0xe] = (char)(uVar2 >> 0x38);
  auVar103[0xf] = (char)((ulong)uVar3 >> 0x38);
  auVar102._14_2_ = auVar103._14_2_;
  auVar102._8_5_ = 0;
  auVar102._0_8_ = uVar2;
  auVar102[0xd] = (char)((ulong)uVar3 >> 0x30);
  auVar101._13_3_ = auVar102._13_3_;
  auVar101._8_4_ = 0;
  auVar101._0_8_ = uVar2;
  auVar101[0xc] = (char)(uVar2 >> 0x30);
  auVar100._12_4_ = auVar101._12_4_;
  auVar100._8_3_ = 0;
  auVar100._0_8_ = uVar2;
  auVar100[0xb] = (char)((ulong)uVar3 >> 0x28);
  auVar99._11_5_ = auVar100._11_5_;
  auVar99._8_2_ = 0;
  auVar99._0_8_ = uVar2;
  auVar99[10] = (char)(uVar2 >> 0x28);
  auVar98._10_6_ = auVar99._10_6_;
  auVar98[8] = 0;
  auVar98._0_8_ = uVar2;
  auVar98[9] = (char)((ulong)uVar3 >> 0x20);
  auVar97._9_7_ = auVar98._9_7_;
  auVar97[8] = (char)(uVar2 >> 0x20);
  auVar97._0_8_ = uVar2;
  Var13 = CONCAT91(CONCAT81(auVar97._8_8_,(char)((ulong)uVar3 >> 0x18)),(char)(uVar2 >> 0x18));
  auVar25._2_10_ = Var13;
  auVar25[1] = (char)((ulong)uVar3 >> 0x10);
  auVar25[0] = (char)(uVar2 >> 0x10);
  auVar24._2_12_ = auVar25;
  auVar24[1] = (char)((ulong)uVar3 >> 8);
  auVar24[0] = (char)(uVar2 >> 8);
  uVar6 = *(ulong *)(in1 + lVar32 * 4);
  uVar7 = *(undefined8 *)(in1 + lVar32 * 5);
  auVar91._8_6_ = 0;
  auVar91._0_8_ = uVar6;
  auVar91[0xe] = (char)(uVar6 >> 0x38);
  auVar91[0xf] = (char)((ulong)uVar7 >> 0x38);
  auVar90._14_2_ = auVar91._14_2_;
  auVar90._8_5_ = 0;
  auVar90._0_8_ = uVar6;
  auVar90[0xd] = (char)((ulong)uVar7 >> 0x30);
  auVar89._13_3_ = auVar90._13_3_;
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar6;
  auVar89[0xc] = (char)(uVar6 >> 0x30);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_3_ = 0;
  auVar88._0_8_ = uVar6;
  auVar88[0xb] = (char)((ulong)uVar7 >> 0x28);
  auVar87._11_5_ = auVar88._11_5_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar6;
  auVar87[10] = (char)(uVar6 >> 0x28);
  auVar86._10_6_ = auVar87._10_6_;
  auVar86[8] = 0;
  auVar86._0_8_ = uVar6;
  auVar86[9] = (char)((ulong)uVar7 >> 0x20);
  auVar85._9_7_ = auVar86._9_7_;
  auVar85[8] = (char)(uVar6 >> 0x20);
  auVar85._0_8_ = uVar6;
  Var16 = CONCAT91(CONCAT81(auVar85._8_8_,(char)((ulong)uVar7 >> 0x18)),(char)(uVar6 >> 0x18));
  auVar27._2_10_ = Var16;
  auVar27[1] = (char)((ulong)uVar7 >> 0x10);
  auVar27[0] = (char)(uVar6 >> 0x10);
  auVar26._2_12_ = auVar27;
  auVar26[1] = (char)((ulong)uVar7 >> 8);
  auVar26[0] = (char)(uVar6 >> 8);
  auVar84._0_2_ = CONCAT11((char)uVar7,(char)uVar6);
  auVar84._2_14_ = auVar26;
  auVar118._0_12_ = auVar46._0_12_;
  auVar118._12_2_ = (short)Var10;
  auVar118._14_2_ = (short)Var13;
  auVar117._12_4_ = auVar118._12_4_;
  auVar117._0_10_ = auVar46._0_10_;
  auVar117._10_2_ = auVar25._0_2_;
  auVar116._10_6_ = auVar117._10_6_;
  auVar116._0_8_ = auVar46._0_8_;
  auVar116._8_2_ = auVar22._0_2_;
  auVar28._4_8_ = auVar116._8_8_;
  auVar28._2_2_ = auVar24._0_2_;
  auVar28._0_2_ = auVar21._0_2_;
  auVar115._0_4_ = CONCAT22(CONCAT11((char)uVar3,(char)uVar2),auVar46._0_2_);
  auVar115._4_12_ = auVar28;
  uVar2 = *(ulong *)(in1 + lVar32 * 6);
  uVar3 = *(undefined8 *)(in1 + lVar32 * 7);
  auVar110._8_6_ = 0;
  auVar110._0_8_ = uVar2;
  auVar110[0xe] = (char)(uVar2 >> 0x38);
  auVar110[0xf] = (char)((ulong)uVar3 >> 0x38);
  auVar109._14_2_ = auVar110._14_2_;
  auVar109._8_5_ = 0;
  auVar109._0_8_ = uVar2;
  auVar109[0xd] = (char)((ulong)uVar3 >> 0x30);
  auVar108._13_3_ = auVar109._13_3_;
  auVar108._8_4_ = 0;
  auVar108._0_8_ = uVar2;
  auVar108[0xc] = (char)(uVar2 >> 0x30);
  auVar107._12_4_ = auVar108._12_4_;
  auVar107._8_3_ = 0;
  auVar107._0_8_ = uVar2;
  auVar107[0xb] = (char)((ulong)uVar3 >> 0x28);
  auVar106._11_5_ = auVar107._11_5_;
  auVar106._8_2_ = 0;
  auVar106._0_8_ = uVar2;
  auVar106[10] = (char)(uVar2 >> 0x28);
  auVar105._10_6_ = auVar106._10_6_;
  auVar105[8] = 0;
  auVar105._0_8_ = uVar2;
  auVar105[9] = (char)((ulong)uVar3 >> 0x20);
  auVar104._9_7_ = auVar105._9_7_;
  auVar104[8] = (char)(uVar2 >> 0x20);
  auVar104._0_8_ = uVar2;
  Var10 = CONCAT91(CONCAT81(auVar104._8_8_,(char)((ulong)uVar3 >> 0x18)),(char)(uVar2 >> 0x18));
  auVar30._2_10_ = Var10;
  auVar30[1] = (char)((ulong)uVar3 >> 0x10);
  auVar30[0] = (char)(uVar2 >> 0x10);
  auVar29._2_12_ = auVar30;
  auVar29[1] = (char)((ulong)uVar3 >> 8);
  auVar29[0] = (char)(uVar2 >> 8);
  auVar121._0_12_ = auVar84._0_12_;
  auVar121._12_2_ = (short)Var16;
  auVar121._14_2_ = (short)Var10;
  auVar120._12_4_ = auVar121._12_4_;
  auVar120._0_10_ = auVar84._0_10_;
  auVar120._10_2_ = auVar30._0_2_;
  auVar119._10_6_ = auVar120._10_6_;
  auVar119._0_8_ = auVar84._0_8_;
  auVar119._8_2_ = auVar27._0_2_;
  auVar31._4_8_ = auVar119._8_8_;
  auVar31._2_2_ = auVar29._0_2_;
  auVar31._0_2_ = auVar26._0_2_;
  auVar122._0_8_ = auVar93._0_8_;
  auVar122._8_4_ = auVar20._0_4_;
  auVar122._12_4_ = auVar23._0_4_;
  auVar114._0_8_ = auVar115._0_8_;
  auVar114._8_4_ = auVar28._0_4_;
  auVar114._12_4_ = auVar31._0_4_;
  *(ulong *)out = CONCAT44(CONCAT22(CONCAT11((char)uVar5,(char)uVar4),auVar57._0_2_),auVar93._0_4_);
  *(ulong *)(out + 8) =
       CONCAT44(CONCAT22(CONCAT11((char)uVar3,(char)uVar2),auVar84._0_2_),auVar115._0_4_);
  lVar32 = (long)out_p;
  *(long *)(out + lVar32) = auVar122._8_8_;
  *(long *)(out + lVar32 + 8) = auVar114._8_8_;
  puVar1 = out + lVar32 * 2;
  *(int *)puVar1 = auVar94._8_4_;
  *(int *)(puVar1 + 4) = auVar111._8_4_;
  *(int *)(puVar1 + 8) = auVar116._8_4_;
  *(int *)(puVar1 + 0xc) = auVar119._8_4_;
  *(undefined4 *)(out + lVar32 * 3 + 8) = auVar95._12_4_;
  *(undefined4 *)(out + lVar32 * 3 + 0xc) = auVar112._12_4_;
  *(undefined4 *)(out + lVar32 * 3 + 0x10) = auVar117._12_4_;
  *(undefined4 *)(out + lVar32 * 3 + 0x14) = auVar120._12_4_;
  uVar33 = CONCAT22(auVar67._8_2_,auVar36._8_2_);
  auVar34._0_8_ = CONCAT26(auVar69._10_2_,CONCAT24(auVar38._10_2_,uVar33));
  auVar34._8_2_ = auVar40._12_2_;
  auVar34._10_2_ = auVar71._12_2_;
  auVar43._12_2_ = auVar41._14_2_;
  auVar43._0_12_ = auVar34;
  auVar43._14_2_ = auVar72._14_2_;
  uVar55 = CONCAT22(auVar75._8_2_,auVar58._8_2_);
  auVar56._0_8_ = CONCAT26(auVar77._10_2_,CONCAT24(auVar60._10_2_,uVar55));
  auVar56._8_2_ = auVar62._12_2_;
  auVar56._10_2_ = auVar79._12_2_;
  auVar65._12_2_ = auVar63._14_2_;
  auVar65._0_12_ = auVar56;
  auVar65._14_2_ = auVar80._14_2_;
  uVar44 = CONCAT22(auVar97._8_2_,auVar47._8_2_);
  auVar45._0_8_ = CONCAT26(auVar99._10_2_,CONCAT24(auVar49._10_2_,uVar44));
  auVar45._8_2_ = auVar51._12_2_;
  auVar45._10_2_ = auVar101._12_2_;
  auVar54._12_2_ = auVar52._14_2_;
  auVar54._0_12_ = auVar45;
  auVar54._14_2_ = auVar102._14_2_;
  uVar82 = CONCAT22(auVar104._8_2_,auVar85._8_2_);
  auVar83._0_8_ = CONCAT26(auVar106._10_2_,CONCAT24(auVar87._10_2_,uVar82));
  auVar83._8_2_ = auVar89._12_2_;
  auVar83._10_2_ = auVar108._12_2_;
  auVar92._12_2_ = auVar90._14_2_;
  auVar92._0_12_ = auVar83;
  auVar92._14_2_ = auVar109._14_2_;
  auVar74._8_4_ = (int)((ulong)auVar34._0_8_ >> 0x20);
  auVar74._0_8_ = auVar34._0_8_;
  auVar74._12_4_ = (int)((ulong)auVar56._0_8_ >> 0x20);
  auVar66._8_4_ = (int)((ulong)auVar45._0_8_ >> 0x20);
  auVar66._0_8_ = auVar45._0_8_;
  auVar66._12_4_ = (int)((ulong)auVar83._0_8_ >> 0x20);
  *(ulong *)(out + lVar32 * 4) = CONCAT44(uVar55,uVar33);
  *(ulong *)(out + lVar32 * 4 + 8) = CONCAT44(uVar82,uVar44);
  *(long *)(out + lVar32 * 5) = auVar74._8_8_;
  *(long *)(out + lVar32 * 5 + 8) = auVar66._8_8_;
  puVar1 = out + lVar32 * 6;
  *(int *)puVar1 = auVar34._8_4_;
  *(int *)(puVar1 + 4) = auVar56._8_4_;
  *(int *)(puVar1 + 8) = auVar45._8_4_;
  *(int *)(puVar1 + 0xc) = auVar83._8_4_;
  *(int *)(out + lVar32 * 7 + 8) = auVar43._12_4_;
  *(int *)(out + lVar32 * 7 + 0xc) = auVar65._12_4_;
  *(int *)(out + lVar32 * 7 + 0x10) = auVar54._12_4_;
  *(int *)(out + lVar32 * 7 + 0x14) = auVar92._12_4_;
  return;
}

Assistant:

static inline void transpose_16x8(unsigned char *in0, unsigned char *in1,
                                  int in_p, unsigned char *out, int out_p) {
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i x8, x9, x10, x11, x12, x13, x14, x15;

  x0 = _mm_loadl_epi64((__m128i *)in0);
  x1 = _mm_loadl_epi64((__m128i *)(in0 + in_p));
  x0 = _mm_unpacklo_epi8(x0, x1);

  x2 = _mm_loadl_epi64((__m128i *)(in0 + 2 * in_p));
  x3 = _mm_loadl_epi64((__m128i *)(in0 + 3 * in_p));
  x1 = _mm_unpacklo_epi8(x2, x3);

  x4 = _mm_loadl_epi64((__m128i *)(in0 + 4 * in_p));
  x5 = _mm_loadl_epi64((__m128i *)(in0 + 5 * in_p));
  x2 = _mm_unpacklo_epi8(x4, x5);

  x6 = _mm_loadl_epi64((__m128i *)(in0 + 6 * in_p));
  x7 = _mm_loadl_epi64((__m128i *)(in0 + 7 * in_p));
  x3 = _mm_unpacklo_epi8(x6, x7);
  x4 = _mm_unpacklo_epi16(x0, x1);

  x8 = _mm_loadl_epi64((__m128i *)in1);
  x9 = _mm_loadl_epi64((__m128i *)(in1 + in_p));
  x8 = _mm_unpacklo_epi8(x8, x9);
  x5 = _mm_unpacklo_epi16(x2, x3);

  x10 = _mm_loadl_epi64((__m128i *)(in1 + 2 * in_p));
  x11 = _mm_loadl_epi64((__m128i *)(in1 + 3 * in_p));
  x9 = _mm_unpacklo_epi8(x10, x11);

  x12 = _mm_loadl_epi64((__m128i *)(in1 + 4 * in_p));
  x13 = _mm_loadl_epi64((__m128i *)(in1 + 5 * in_p));
  x10 = _mm_unpacklo_epi8(x12, x13);
  x12 = _mm_unpacklo_epi16(x8, x9);

  x14 = _mm_loadl_epi64((__m128i *)(in1 + 6 * in_p));
  x15 = _mm_loadl_epi64((__m128i *)(in1 + 7 * in_p));
  x11 = _mm_unpacklo_epi8(x14, x15);
  x13 = _mm_unpacklo_epi16(x10, x11);

  x6 = _mm_unpacklo_epi32(x4, x5);
  x7 = _mm_unpackhi_epi32(x4, x5);
  x14 = _mm_unpacklo_epi32(x12, x13);
  x15 = _mm_unpackhi_epi32(x12, x13);

  // Store first 4-line result
  _mm_storeu_si128((__m128i *)out, _mm_unpacklo_epi64(x6, x14));
  _mm_storeu_si128((__m128i *)(out + out_p), _mm_unpackhi_epi64(x6, x14));
  _mm_storeu_si128((__m128i *)(out + 2 * out_p), _mm_unpacklo_epi64(x7, x15));
  _mm_storeu_si128((__m128i *)(out + 3 * out_p), _mm_unpackhi_epi64(x7, x15));

  x4 = _mm_unpackhi_epi16(x0, x1);
  x5 = _mm_unpackhi_epi16(x2, x3);
  x12 = _mm_unpackhi_epi16(x8, x9);
  x13 = _mm_unpackhi_epi16(x10, x11);

  x6 = _mm_unpacklo_epi32(x4, x5);
  x7 = _mm_unpackhi_epi32(x4, x5);
  x14 = _mm_unpacklo_epi32(x12, x13);
  x15 = _mm_unpackhi_epi32(x12, x13);

  // Store second 4-line result
  _mm_storeu_si128((__m128i *)(out + 4 * out_p), _mm_unpacklo_epi64(x6, x14));
  _mm_storeu_si128((__m128i *)(out + 5 * out_p), _mm_unpackhi_epi64(x6, x14));
  _mm_storeu_si128((__m128i *)(out + 6 * out_p), _mm_unpacklo_epi64(x7, x15));
  _mm_storeu_si128((__m128i *)(out + 7 * out_p), _mm_unpackhi_epi64(x7, x15));
}